

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasinterval.cpp
# Opt level: O0

BOOL __thiscall
LASinterval::merge_cells(LASinterval *this,U32 num_indices,I32 *indices,I32 new_index)

{
  unordered_map<int,_LASintervalStartCell_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>_>
  *puVar1;
  bool bVar2;
  BOOL BVar3;
  reference ppVar4;
  pair<std::__detail::_Node_iterator<std::pair<const_int,_LASintervalStartCell_*>,_false,_false>,_bool>
  pVar5;
  pair<const_int,_LASintervalStartCell_*> local_80;
  _Node_iterator_base<std::pair<const_int,_LASintervalStartCell_*>,_false> local_68;
  _Node_iterator_base<std::pair<const_int,_LASintervalStartCell_*>,_false> local_60;
  undefined1 local_58;
  pair<const_int,_LASintervalStartCell_*> local_50;
  _Node_iterator_base<std::pair<const_int,_LASintervalStartCell_*>,_false> local_40;
  _Node_iterator_base<std::pair<const_int,_LASintervalStartCell_*>,_false> local_38;
  iterator hash_element;
  U32 i;
  I32 new_index_local;
  I32 *indices_local;
  U32 num_indices_local;
  LASinterval *this_local;
  
  hash_element.super__Node_iterator_base<std::pair<const_int,_LASintervalStartCell_*>,_false>._M_cur
  ._4_4_ = new_index;
  if (num_indices == 1) {
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_LASintervalStartCell_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>_>
         ::find((unordered_map<int,_LASintervalStartCell_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>_>
                 *)this->cells,indices);
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_LASintervalStartCell_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>_>
         ::end((unordered_map<int,_LASintervalStartCell_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>_>
                *)this->cells);
    bVar2 = std::__detail::operator==(&local_38,&local_40);
    if (bVar2) {
      return false;
    }
    puVar1 = (unordered_map<int,_LASintervalStartCell_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>_>
              *)this->cells;
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_int,_LASintervalStartCell_*>,_false,_false>::operator*
                       ((_Node_iterator<std::pair<const_int,_LASintervalStartCell_*>,_false,_false>
                         *)&local_38);
    std::pair<const_int,_LASintervalStartCell_*>::pair<LASintervalStartCell_*&,_true>
              (&local_50,
               (int *)((long)&hash_element.
                              super__Node_iterator_base<std::pair<const_int,_LASintervalStartCell_*>,_false>
                              ._M_cur + 4),&ppVar4->second);
    pVar5 = std::
            unordered_map<int,_LASintervalStartCell_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>_>
            ::insert(puVar1,&local_50);
    local_60._M_cur =
         (__node_type *)
         pVar5.first.super__Node_iterator_base<std::pair<const_int,_LASintervalStartCell_*>,_false>.
         _M_cur;
    local_58 = pVar5.second;
    local_68._M_cur = local_38._M_cur;
    std::
    unordered_map<int,_LASintervalStartCell_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>_>
    ::erase((unordered_map<int,_LASintervalStartCell_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>_>
             *)this->cells,(iterator)local_38._M_cur);
  }
  else {
    if (this->cells_to_merge != (void *)0x0) {
      std::
      set<LASintervalStartCell_*,_std::less<LASintervalStartCell_*>,_std::allocator<LASintervalStartCell_*>_>
      ::clear((set<LASintervalStartCell_*,_std::less<LASintervalStartCell_*>,_std::allocator<LASintervalStartCell_*>_>
               *)this->cells_to_merge);
    }
    for (hash_element.super__Node_iterator_base<std::pair<const_int,_LASintervalStartCell_*>,_false>
         ._M_cur._0_4_ = 0;
        (uint)hash_element.
              super__Node_iterator_base<std::pair<const_int,_LASintervalStartCell_*>,_false>._M_cur
        < num_indices;
        hash_element.super__Node_iterator_base<std::pair<const_int,_LASintervalStartCell_*>,_false>.
        _M_cur._0_4_ = (uint)hash_element.
                             super__Node_iterator_base<std::pair<const_int,_LASintervalStartCell_*>,_false>
                             ._M_cur + 1) {
      add_cell_to_merge_cell_set
                (this,indices[(uint)hash_element.
                                    super__Node_iterator_base<std::pair<const_int,_LASintervalStartCell_*>,_false>
                                    ._M_cur],true);
    }
    BVar3 = merge(this,true);
    if (!BVar3) {
      return false;
    }
    puVar1 = (unordered_map<int,_LASintervalStartCell_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>_>
              *)this->cells;
    std::pair<const_int,_LASintervalStartCell_*>::pair<LASintervalStartCell_*&,_true>
              (&local_80,
               (int *)((long)&hash_element.
                              super__Node_iterator_base<std::pair<const_int,_LASintervalStartCell_*>,_false>
                              ._M_cur + 4),&this->merged_cells);
    std::
    unordered_map<int,_LASintervalStartCell_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>_>
    ::insert(puVar1,&local_80);
    this->merged_cells = (LASintervalStartCell *)0x0;
  }
  return true;
}

Assistant:

BOOL LASinterval::merge_cells(const U32 num_indices, const I32* indices, const I32 new_index)
{
  U32 i;
  if (num_indices == 1)
  {
    my_cell_hash::iterator hash_element = ((my_cell_hash*)cells)->find(indices[0]);
    if (hash_element == ((my_cell_hash*)cells)->end())
    {
      return FALSE;
    }
    ((my_cell_hash*)cells)->insert(my_cell_hash::value_type(new_index, (*hash_element).second));
    ((my_cell_hash*)cells)->erase(hash_element);
  }
  else
  {
    if (cells_to_merge) ((my_cell_set*)cells_to_merge)->clear();
    for (i = 0; i < num_indices; i++)
    {
      add_cell_to_merge_cell_set(indices[i], TRUE);
    }
    if (!merge(TRUE)) return FALSE;
    ((my_cell_hash*)cells)->insert(my_cell_hash::value_type(new_index, merged_cells));
    merged_cells = 0;
  }
  return TRUE;
}